

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_rsassa_pkcs1_v15_verify
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  size_t __size;
  byte bVar1;
  int iVar2;
  uchar *output;
  uchar *dst;
  size_t sVar3;
  
  __size = ctx->len;
  if ((mode != 1) || (iVar2 = -0x4080, ctx->padding == 0)) {
    output = (uchar *)calloc(1,__size);
    iVar2 = -0x10;
    if ((output == (uchar *)0x0) || (dst = (uchar *)calloc(1,__size), dst == (uchar *)0x0)) {
      dst = (uchar *)0x0;
    }
    else {
      iVar2 = rsa_rsassa_pkcs1_v15_encode(md_alg,hashlen,hash,__size,dst);
      if (iVar2 == 0) {
        if (mode == 0) {
          iVar2 = mbedtls_rsa_public(ctx,sig,output);
        }
        else {
          iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,output);
        }
        if (iVar2 == 0) {
          if (__size == 0) {
            iVar2 = 0;
          }
          else {
            bVar1 = 0;
            sVar3 = 0;
            do {
              bVar1 = bVar1 | dst[sVar3] ^ output[sVar3];
              sVar3 = sVar3 + 1;
            } while (__size != sVar3);
            iVar2 = -0x4380;
            if (bVar1 == 0) {
              iVar2 = 0;
            }
          }
        }
      }
    }
    if (output != (uchar *)0x0) {
      if (__size != 0) {
        sVar3 = 0;
        do {
          output[sVar3] = '\0';
          sVar3 = sVar3 + 1;
        } while (__size != sVar3);
      }
      free(output);
    }
    if (dst != (uchar *)0x0) {
      if (__size != 0) {
        sVar3 = 0;
        do {
          dst[sVar3] = '\0';
          sVar3 = sVar3 + 1;
        } while (__size != sVar3);
      }
      free(dst);
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_verify( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode,
                                 mbedtls_md_type_t md_alg,
                                 unsigned int hashlen,
                                 const unsigned char *hash,
                                 const unsigned char *sig )
{
    int ret = 0;
    const size_t sig_len = ctx->len;
    unsigned char *encoded = NULL, *encoded_expected = NULL;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /*
     * Prepare expected PKCS1 v1.5 encoding of hash.
     */

    if( ( encoded          = mbedtls_calloc( 1, sig_len ) ) == NULL ||
        ( encoded_expected = mbedtls_calloc( 1, sig_len ) ) == NULL )
    {
        ret = MBEDTLS_ERR_MPI_ALLOC_FAILED;
        goto cleanup;
    }

    if( ( ret = rsa_rsassa_pkcs1_v15_encode( md_alg, hashlen, hash, sig_len,
                                             encoded_expected ) ) != 0 )
        goto cleanup;

    /*
     * Apply RSA primitive to get what should be PKCS1 encoded hash.
     */

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, encoded )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, encoded );
    if( ret != 0 )
        goto cleanup;

    /*
     * Compare
     */

    if( ( ret = mbedtls_safer_memcmp( encoded, encoded_expected,
                                      sig_len ) ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto cleanup;
    }

cleanup:

    if( encoded != NULL )
    {
        mbedtls_zeroize( encoded, sig_len );
        mbedtls_free( encoded );
    }

    if( encoded_expected != NULL )
    {
        mbedtls_zeroize( encoded_expected, sig_len );
        mbedtls_free( encoded_expected );
    }

    return( ret );
}